

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QDBusMenuItem>::insert
          (QMovableArrayOps<QDBusMenuItem> *this,qsizetype i,qsizetype n,parameter_type t)

{
  QDBusMenuItem **ppQVar1;
  qsizetype *pqVar2;
  int iVar3;
  long lVar4;
  qsizetype inserts;
  QDBusMenuItem *pQVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QVariantMap QStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = t->m_id;
  QStack_40.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
        )(t->m_properties).d.d.ptr;
  if (QStack_40.d.d.ptr !=
      (totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
       )0x0) {
    LOCK();
    *(int *)QStack_40.d.d.ptr = *(int *)QStack_40.d.d.ptr + 1;
    UNLOCK();
  }
  bVar6 = (this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>.size
          != 0;
  QArrayDataPointer<QDBusMenuItem>::detachAndGrow
            ((QArrayDataPointer<QDBusMenuItem> *)this,(uint)(i == 0 && bVar6),n,
             (QDBusMenuItem **)0x0,(QArrayDataPointer<QDBusMenuItem> *)0x0);
  if (i == 0 && bVar6) {
    for (; n != 0; n = n + -1) {
      pQVar5 = (this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>.
               ptr;
      pQVar5[-1].m_id = iVar3;
      pQVar5[-1].m_properties.d.d.ptr =
           (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
            *)QStack_40.d.d.ptr;
      if (QStack_40.d.d.ptr !=
          (totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
           )0x0) {
        LOCK();
        *(int *)QStack_40.d.d.ptr = *(int *)QStack_40.d.d.ptr + 1;
        UNLOCK();
      }
      ppQVar1 = &(this->super_QGenericArrayOps<QDBusMenuItem>).
                 super_QArrayDataPointer<QDBusMenuItem>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
      pqVar2 = &(this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>
                .size;
      *pqVar2 = *pqVar2 + 1;
    }
  }
  else {
    pQVar5 = (this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>.
             ptr + i;
    memmove(pQVar5 + n,pQVar5,
            ((this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>.
             size - i) * 0x10);
    lVar4 = n;
    if (n != 0) {
      do {
        pQVar5->m_id = iVar3;
        (pQVar5->m_properties).d.d.ptr =
             (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
              *)QStack_40.d.d.ptr;
        if (QStack_40.d.d.ptr !=
            (totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
             )0x0) {
          LOCK();
          *(int *)QStack_40.d.d.ptr = *(int *)QStack_40.d.d.ptr + 1;
          UNLOCK();
        }
        lVar4 = lVar4 + -1;
        pQVar5 = pQVar5 + 1;
      } while (lVar4 != 0);
    }
    pqVar2 = &(this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>.
              size;
    *pqVar2 = *pqVar2 + n;
  }
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&QStack_40.d);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }